

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O2

void __thiscall
despot::option::PrintUsageImplementation::LineWrapper::write_one_line
          (LineWrapper *this,IStringWriter *write)

{
  uint uVar1;
  ulong in_RAX;
  ulong uStack_18;
  int _;
  
  uStack_18 = in_RAX;
  if (this->wrote_something == true) {
    (*write->_vptr_IStringWriter[2])(write,"\n",1);
    uStack_18 = uStack_18 & 0xffffffff;
    indent(write,&_,this->x);
  }
  uVar1 = this->tail + 1U & 0xf;
  if (uVar1 != this->head) {
    this->tail = uVar1;
    (*write->_vptr_IStringWriter[2])(write,this->datbuf[uVar1],(ulong)(uint)this->lenbuf[uVar1]);
  }
  this->wrote_something = true;
  return;
}

Assistant:

void write_one_line(IStringWriter& write) {
			if (wrote_something) // if we already wrote something, we need to start a new line
			{
				write("\n", 1);
				int _ = 0;
				indent(write, _, x);
			}

			if (!buf_empty()) {
				buf_next();
				write(datbuf[tail], lenbuf[tail]);
			}

			wrote_something = true;
		}